

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O2

string * UniqueObjectHelper<std::__cxx11::string>(string *__return_storage_ptr__,int index)

{
  allocator local_59;
  char buffer [64];
  
  snprintf(buffer,0x40,"%d",index);
  std::__cxx11::string::string((string *)__return_storage_ptr__,buffer,&local_59);
  return __return_storage_ptr__;
}

Assistant:

string UniqueObjectHelper(int index) {
  char buffer[64];
  snprintf(buffer, sizeof(buffer), "%d", index);
  return buffer;
}